

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessPreprocessorDirective
          (ConversionStream *this,iterator *Token)

{
  TokenListType *this_00;
  iterator __position;
  int iVar1;
  long lVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  string Directive;
  _List_node_base *local_78;
  undefined8 local_70;
  _List_node_base local_68;
  string local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  __position = (iterator)Token->_M_node;
  this_00 = &this->m_Tokens;
  p_Var3 = __position._M_node;
  do {
    p_Var3 = p_Var3->_M_next;
    p_Var4 = (_List_node_base *)this_00;
    if (p_Var3 == (_List_node_base *)this_00) break;
    lVar2 = std::__cxx11::string::find_first_of((char *)&p_Var3[3]._M_prev,0x83070f,0);
    p_Var4 = p_Var3;
  } while (lVar2 == -1);
  local_78 = Token->_M_node[1]._M_prev;
  local_38._M_current = (char *)((long)&local_78->_M_next + (long)Token->_M_node[2]._M_next);
  Parsing::
  RefinePreprocessorDirective<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_58,(Parsing *)&local_78,&local_38,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38._M_current);
  iVar1 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar1 == 0) {
    p_Var3 = Token->_M_node->_M_next;
    Token->_M_node = p_Var3;
    if ((p_Var3 != p_Var4) &&
       (iVar1 = std::__cxx11::string::compare((char *)&p_Var3[1]._M_prev), iVar1 == 0)) {
      p_Var3 = Token->_M_node->_M_next;
      if ((((p_Var3 == p_Var4) ||
           ((*(int *)&p_Var3[1]._M_next != 0x135 || (p_Var3 = p_Var3->_M_next, p_Var3 == p_Var4))))
          || ((*(int *)&p_Var3[1]._M_next != 0xd4 && (*(int *)&p_Var3[1]._M_next != 0x102)))) ||
         ((p_Var3->_M_next == p_Var4 || (*(int *)&p_Var3->_M_next[1]._M_next != 0x136)))) {
        local_78 = &local_68;
        local_70 = 0;
        local_68._M_next._0_1_ = 0;
      }
      else {
        local_78 = &local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,p_Var3[1]._M_prev,
                   (long)&(p_Var3[1]._M_prev)->_M_next + (long)&(p_Var3[2]._M_next)->_M_next);
      }
      iVar1 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar1 == 0) {
        this->m_bUseRowMajorMatrices = true;
      }
      while (p_Var4 != __position._M_node) {
        p_Var3 = (__position._M_node)->_M_next;
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        _M_erase(this_00,__position);
        __position._M_node = p_Var3;
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(local_68._M_next._1_7_,local_68._M_next._0_1_) + 1);
      }
    }
  }
  Token->_M_node = p_Var4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessPreprocessorDirective(TokenListType::iterator& Token)
{
    const TokenListType::iterator DirectiveStart = Token;

    TokenListType::iterator DirectiveEnd = Token;
    ++DirectiveEnd;
    while (DirectiveEnd != m_Tokens.end() && DirectiveEnd->Delimiter.find_first_of("\r\n") == std::string::npos)
        ++DirectiveEnd;

    const std::string Directive = RefinePreprocessorDirective(Token->Literal);
    if (Directive == "pragma")
    {
        // # pragma pack_matrix( row_major )
        // ^

        ++Token;
        // # pragma pack_matrix( row_major )
        //          ^
        if (Token != DirectiveEnd && Token->Literal == "pack_matrix")
        {
            auto ParsePragmaPackMatrix = [](TokenListType::iterator Token, TokenListType::iterator End) -> std::string {
                // # pragma pack_matrix( row_major )
                //          ^

                ++Token;
                // # pragma pack_matrix( row_major )
                //                     ^
                if (Token == End || Token->Type != TokenType::OpenParen)
                    return "";

                ++Token;
                // # pragma pack_matrix( row_major )
                //                       ^
                if (Token == End || (Token->Type != TokenType::kw_row_major && Token->Type != TokenType::kw_column_major))
                    return "";

                const std::string& PackMatrix = Token->Literal;

                ++Token;
                // # pragma pack_matrix( row_major )
                //                                 ^
                if (Token == End || Token->Type != TokenType::ClosingParen)
                    return "";

                return PackMatrix;
            };
            const std::string PackMatrix = ParsePragmaPackMatrix(Token, DirectiveEnd);
            if (PackMatrix == "row_major")
                m_bUseRowMajorMatrices = true;

            // Delete the directive
            m_Tokens.erase(DirectiveStart, DirectiveEnd);
        }
    }

    // Go to the end of the directive
    Token = DirectiveEnd;
}